

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O3

int __thiscall ColorMenu::handle(ColorMenu *this,int e)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int y;
  int x;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  iVar2 = 0;
  if (7 < e - 1U) {
    return 0;
  }
  uVar4 = this->which;
  switch(e) {
  case 1:
  case 5:
    iVar2 = Fl::e_x_root - (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.x_;
    uVar5 = iVar2 - 4;
    uVar1 = uVar5 / 0xe;
    if (iVar2 < 4) {
      uVar1 = uVar5;
    }
    iVar2 = Fl::e_y_root - (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.y_;
    uVar5 = iVar2 - 4;
    uVar6 = uVar5 / 0xe;
    if (iVar2 < 4) {
      uVar6 = uVar5;
    }
    uVar3 = *(uint *)&(this->super_Fl_Window).field_0xec;
    uVar5 = uVar1 + uVar6 * 8;
    if (0x1f < uVar6) {
      uVar5 = uVar3;
    }
    if (7 < uVar1) {
      uVar5 = uVar3;
    }
    goto LAB_001f536d;
  case 2:
    goto switchD_001f5308_caseD_2;
  default:
    goto switchD_001f5308_caseD_3;
  case 8:
    if (0xff50 < Fl::e_keysym) {
      switch(Fl::e_keysym) {
      case 0xff51:
        uVar5 = uVar4 - 1;
        if (uVar4 == 0) {
          uVar5 = 0;
        }
        break;
      case 0xff52:
        uVar5 = uVar4 - 8;
        if (uVar4 < 8) {
          uVar5 = uVar4;
        }
        break;
      case 0xff53:
        uVar5 = uVar4 + (uVar4 < 0xff);
        break;
      case 0xff54:
        uVar5 = uVar4 + 8;
        if (0xf7 < uVar4) {
          uVar5 = uVar4;
        }
        break;
      default:
        if (Fl::e_keysym != 0xff8d) {
          return 0;
        }
        goto switchD_001f5308_caseD_2;
      }
LAB_001f536d:
      if (uVar5 == uVar4) {
        return 1;
      }
      this->which = uVar5;
      Fl_Widget::damage((Fl_Widget *)this,'\x01');
      uVar6 = uVar5 & 7;
      uVar5 = uVar5 >> 3;
      uVar4 = (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.x_;
      uVar1 = (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.y_;
      Fl::get_mouse(&local_34,&local_38);
      Fl::screen_xywh((int *)&local_3c,(int *)&local_40,&local_44,&local_48,local_34,local_38);
      if ((int)uVar4 <= (int)local_3c) {
        uVar4 = local_3c;
      }
      uVar3 = (local_3c + local_44 + uVar6 * -0xe) - 0x16;
      if ((int)(uVar6 * 0xe + uVar4 + 0x16) < (int)(local_3c + local_44)) {
        uVar3 = uVar4;
      }
      if ((int)uVar1 <= (int)local_40) {
        uVar1 = local_40;
      }
      uVar4 = (local_40 + local_48 + uVar5 * -0xe) - 0x16;
      if ((int)(uVar5 * 0xe + uVar1 + 0x16) < (int)(local_40 + local_48)) {
        uVar4 = uVar1;
      }
      uVar1 = uVar6 * -0xe;
      if (3 < (int)(uVar6 * 0xe + uVar3 + 4)) {
        uVar1 = uVar3;
      }
      uVar6 = uVar5 * -0xe;
      if (3 < (int)(uVar5 * 0xe + uVar4 + 4)) {
        uVar6 = uVar4;
      }
      (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[4])
                (this,(ulong)uVar1,(ulong)uVar6,
                 (ulong)(uint)(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
                 (ulong)(uint)(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_);
      return 1;
    }
    if (Fl::e_keysym != 0xff0d) {
      if (Fl::e_keysym != 0xff1b) {
        return 0;
      }
      this->which = *(Fl_Color *)&(this->super_Fl_Window).field_0xec;
    }
switchD_001f5308_caseD_2:
    this->done = 1;
    iVar2 = 1;
switchD_001f5308_caseD_3:
    return iVar2;
  }
}

Assistant:

int ColorMenu::handle(int e) {
  Fl_Color c = which;
  switch (e) {
  case FL_PUSH:
  case FL_DRAG: {
    int X = (Fl::event_x_root() - x() - BORDER);
    if (X >= 0) X = X/BOXSIZE;
    int Y = (Fl::event_y_root() - y() - BORDER);
    if (Y >= 0) Y = Y/BOXSIZE;
    if (X >= 0 && X < 8 && Y >= 0 && Y < 32)
      c = 8*Y + X;
    else
      c = initial;
    } break;
  case FL_RELEASE:
    done = 1;
    return 1;
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
    case FL_Up: if (c > 7) c -= 8; break;
    case FL_Down: if (c < 256-8) c += 8; break;
    case FL_Left: if (c > 0) c--; break;
    case FL_Right: if (c < 255) c++; break;
    case FL_Escape: which = initial; done = 1; return 1;
    case FL_KP_Enter:
    case FL_Enter: done = 1; return 1;
    default: return 0;
    }
    break;
  default:
    return 0;
  }
  if (c != which) {
    which = (Fl_Color)c; damage(FL_DAMAGE_CHILD);
    int bx = (c%8)*BOXSIZE+BORDER;
    int by = (c/8)*BOXSIZE+BORDER;
    int px = x();
    int py = y();
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
    if (px < scr_x) px = scr_x;
    if (px+bx+BOXSIZE+BORDER >= scr_x+scr_w) px = scr_x+scr_w-bx-BOXSIZE-BORDER;
    if (py < scr_y) py = scr_y;
    if (py+by+BOXSIZE+BORDER >= scr_y+scr_h) py = scr_y+scr_h-by-BOXSIZE-BORDER;
    if (px+bx < BORDER) px = BORDER-bx;
    if (py+by < BORDER) py = BORDER-by;
    position(px,py);
  }
  return 1;
}